

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O3

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *__s;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  uchar *input;
  uchar sum [32];
  uchar local_58 [40];
  
  if (ctx == (mbedtls_md_context_t *)0x0) {
    return -0x5100;
  }
  if (ctx->md_info == (mbedtls_md_info_t *)0x0) {
    return -0x5100;
  }
  input = (uchar *)ctx->hmac_ctx;
  if (input == (uchar *)0x0) {
    return -0x5100;
  }
  __n = (size_t)ctx->md_info->block_size;
  if (__n < keylen) {
    iVar1 = mbedtls_md_starts(ctx);
    if (((iVar1 != 0) || (iVar1 = mbedtls_md_update(ctx,key,keylen), iVar1 != 0)) ||
       (iVar1 = mbedtls_md_finish(ctx,local_58), iVar1 != 0)) goto LAB_0120e4f4;
    input = (uchar *)ctx->hmac_ctx;
    keylen = (size_t)ctx->md_info->size;
    __n = (size_t)ctx->md_info->block_size;
    key = local_58;
  }
  __s = input + __n;
  switchD_00569a20::default(input,0x36,__n);
  switchD_00569a20::default(__s,0x5c,(ulong)ctx->md_info->block_size);
  if (keylen < 8) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      *(ulong *)(input + uVar3) = *(ulong *)(input + uVar3) ^ *(ulong *)(key + uVar3);
      uVar2 = uVar3 + 8;
      uVar4 = uVar3 + 0x10;
      uVar3 = uVar2;
    } while (uVar4 <= keylen);
  }
  if (uVar2 < keylen) {
    do {
      input[uVar2] = input[uVar2] ^ key[uVar2];
      uVar2 = uVar2 + 1;
    } while (keylen != uVar2);
  }
  if (keylen < 8) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      *(ulong *)(__s + uVar3) = *(ulong *)(__s + uVar3) ^ *(ulong *)(key + uVar3);
      uVar2 = uVar3 + 8;
      uVar4 = uVar3 + 0x10;
      uVar3 = uVar2;
    } while (uVar4 <= keylen);
  }
  if (uVar2 < keylen) {
    do {
      __s[uVar2] = __s[uVar2] ^ key[uVar2];
      uVar2 = uVar2 + 1;
    } while (keylen != uVar2);
  }
  iVar1 = mbedtls_md_starts(ctx);
  if (iVar1 == 0) {
    iVar1 = mbedtls_md_update(ctx,input,(ulong)ctx->md_info->block_size);
  }
LAB_0120e4f4:
  mbedtls_platform_zeroize(local_58,0x20);
  return iVar1;
}

Assistant:

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;

    if (ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    if (keylen > (size_t) ctx->md_info->block_size) {
        if ((ret = mbedtls_md_starts(ctx)) != 0) {
            goto cleanup;
        }
        if ((ret = mbedtls_md_update(ctx, key, keylen)) != 0) {
            goto cleanup;
        }
        if ((ret = mbedtls_md_finish(ctx, sum)) != 0) {
            goto cleanup;
        }

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset(ipad, 0x36, ctx->md_info->block_size);
    memset(opad, 0x5C, ctx->md_info->block_size);

    mbedtls_xor(ipad, ipad, key, keylen);
    mbedtls_xor(opad, opad, key, keylen);

    if ((ret = mbedtls_md_starts(ctx)) != 0) {
        goto cleanup;
    }
    if ((ret = mbedtls_md_update(ctx, ipad,
                                 ctx->md_info->block_size)) != 0) {
        goto cleanup;
    }

cleanup:
    mbedtls_platform_zeroize(sum, sizeof(sum));

    return ret;
}